

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

void rehashtab(lua_State *L,GCtab *t,cTValue *ek)

{
  uint uVar1;
  uint64_t uVar2;
  bool bVar3;
  uint32_t nn;
  uint32_t uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint32_t hbits;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint32_t bins [28];
  uint32_t local_a8 [30];
  
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  uVar1 = t->asize;
  iVar13 = 0;
  iVar7 = 0;
  if (uVar1 != 0) {
    lVar6 = 0;
    uVar14 = 0;
    iVar7 = 0;
    do {
      uVar8 = 2 << ((byte)lVar6 & 0x1f);
      uVar12 = (uint)uVar14;
      if ((uVar8 < uVar1) || (bVar3 = true, uVar8 = uVar1 - 1, uVar12 <= uVar1 - 1)) {
        iVar9 = 0;
        if (uVar12 <= uVar8) {
          iVar9 = 0;
          do {
            iVar9 = iVar9 + (uint)(*(long *)((t->array).ptr64 + uVar14 * 8) != -1);
            uVar11 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar11;
          } while (uVar11 <= uVar8);
          uVar14 = (ulong)(uVar12 + 1);
          if (uVar12 + 1 <= uVar8 + 1) {
            uVar14 = (ulong)(uVar8 + 1);
          }
        }
        local_a8[lVar6] = local_a8[lVar6] + iVar9;
        iVar7 = iVar7 + iVar9;
        bVar3 = false;
      }
    } while ((!bVar3) && (lVar6 = lVar6 + 1, lVar6 != 0x1c));
  }
  uVar1 = t->hmask;
  uVar2 = (t->node).ptr64;
  iVar9 = 0;
  uVar14 = 0;
  do {
    if (*(long *)(uVar2 + uVar14 * 0x18) != -1) {
      uVar4 = countint((cTValue *)(uVar2 + uVar14 * 0x18 + 8),local_a8);
      iVar9 = iVar9 + uVar4;
      iVar13 = iVar13 + 1;
    }
    uVar8 = (int)uVar14 + 1;
    uVar14 = (ulong)uVar8;
  } while (uVar8 <= uVar1);
  uVar4 = countint(ek,local_a8);
  iVar5 = uVar4 + iVar9 + iVar7;
  hbits = 0;
  iVar9 = 0;
  uVar4 = 0;
  uVar1 = iVar5 * 2;
  if (uVar1 != 0) {
    uVar8 = 0;
    uVar12 = 1;
    uVar4 = 0;
    iVar9 = 0;
    iVar10 = 0;
    do {
      if (local_a8[uVar8] != 0) {
        iVar10 = iVar10 + local_a8[uVar8];
        if (uVar12 < (uint)(iVar10 * 2)) {
          uVar4 = (2 << ((byte)uVar8 & 0x1f)) + 1;
          iVar9 = iVar10;
        }
      }
      uVar8 = uVar8 + 1;
      uVar12 = 1 << ((byte)uVar8 & 0x1f);
    } while ((uVar12 < uVar1) && (iVar10 != iVar5));
  }
  iVar9 = (iVar7 + iVar13 + 1) - iVar9;
  if ((iVar9 != 0) && (hbits = 1, iVar9 != 1)) {
    uVar1 = 0x1f;
    if (iVar9 - 1U != 0) {
      for (; iVar9 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    hbits = (uVar1 ^ 0xffffffe0) + 0x21;
  }
  lj_tab_resize(L,t,uVar4,hbits);
  return;
}

Assistant:

static void rehashtab(lua_State *L, GCtab *t, cTValue *ek)
{
  uint32_t bins[LJ_MAX_ABITS];
  uint32_t total, asize, na, i;
  for (i = 0; i < LJ_MAX_ABITS; i++) bins[i] = 0;
  asize = countarray(t, bins);
  total = 1 + asize;
  total += counthash(t, bins, &asize);
  asize += countint(ek, bins);
  na = bestasize(bins, &asize);
  total -= na;
  lj_tab_resize(L, t, asize, hsize2hbits(total));
}